

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cpp
# Opt level: O2

void __thiscall Stack::Stack(Stack *this)

{
  (this->super_JsonProtocol)._vptr_JsonProtocol = (_func_int **)&PTR__Stack_00193db0;
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  (this->file)._M_string_length = 0;
  (this->file).field_2._M_local_buf[0] = '\0';
  (this->functionName)._M_dataplus._M_p = (pointer)&(this->functionName).field_2;
  (this->functionName)._M_string_length = 0;
  (this->functionName).field_2._M_local_buf[0] = '\0';
  this->level = 0;
  this->line = 0;
  (this->localVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->upvalueVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->upvalueVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->upvalueVariables).super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::make_shared<Arena<Variable>>();
  return;
}

Assistant:

Stack::Stack()
	: level(0), line(0), variableArena(std::make_shared<Arena<Variable>>()) {
}